

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlyParser.cpp
# Opt level: O0

bool Assimp::PLY::ElementInstanceList::ParseInstanceListBinary
               (IOStreamBuffer<char> *streamBuffer,vector<char,_std::allocator<char>_> *buffer,
               char **pCur,uint *bufferSize,Element *pcElement,ElementInstanceList *p_pcOut,
               PLYImporter *loader,bool p_bBE)

{
  reference p_pcOut_00;
  undefined1 local_58 [8];
  ElementInstance elt;
  uint i;
  bool p_bBE_local;
  ElementInstanceList *p_pcOut_local;
  Element *pcElement_local;
  uint *bufferSize_local;
  char **pCur_local;
  vector<char,_std::allocator<char>_> *buffer_local;
  IOStreamBuffer<char> *streamBuffer_local;
  
  elt.alProperties.
  super__Vector_base<Assimp::PLY::PropertyInstance,_std::allocator<Assimp::PLY::PropertyInstance>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = p_bBE;
  if (pcElement == (Element *)0x0) {
    __assert_fail("__null != pcElement",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/Ply/PlyParser.cpp"
                  ,0x2e1,
                  "static bool Assimp::PLY::ElementInstanceList::ParseInstanceListBinary(IOStreamBuffer<char> &, std::vector<char> &, const char *&, unsigned int &, const PLY::Element *, PLY::ElementInstanceList *, PLYImporter *, bool)"
                 );
  }
  for (elt.alProperties.
       super__Vector_base<Assimp::PLY::PropertyInstance,_std::allocator<Assimp::PLY::PropertyInstance>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
      (uint)elt.alProperties.
            super__Vector_base<Assimp::PLY::PropertyInstance,_std::allocator<Assimp::PLY::PropertyInstance>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage < pcElement->NumOccur;
      elt.alProperties.
      super__Vector_base<Assimp::PLY::PropertyInstance,_std::allocator<Assimp::PLY::PropertyInstance>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ =
           (uint)elt.alProperties.
                 super__Vector_base<Assimp::PLY::PropertyInstance,_std::allocator<Assimp::PLY::PropertyInstance>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage + 1) {
    if (p_pcOut == (ElementInstanceList *)0x0) {
      ElementInstance::ElementInstance((ElementInstance *)local_58);
      ElementInstance::ParseInstanceBinary
                (streamBuffer,buffer,pCur,bufferSize,pcElement,(ElementInstance *)local_58,
                 (bool)(elt.alProperties.
                        super__Vector_base<Assimp::PLY::PropertyInstance,_std::allocator<Assimp::PLY::PropertyInstance>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ & 1));
      if (pcElement->eSemantic == EEST_Vertex) {
        PLYImporter::LoadVertex
                  (loader,pcElement,(ElementInstance *)local_58,
                   (uint)elt.alProperties.
                         super__Vector_base<Assimp::PLY::PropertyInstance,_std::allocator<Assimp::PLY::PropertyInstance>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
      }
      else if (pcElement->eSemantic == EEST_Face) {
        PLYImporter::LoadFace
                  (loader,pcElement,(ElementInstance *)local_58,
                   (uint)elt.alProperties.
                         super__Vector_base<Assimp::PLY::PropertyInstance,_std::allocator<Assimp::PLY::PropertyInstance>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
      }
      else if (pcElement->eSemantic == EEST_TriStrip) {
        PLYImporter::LoadFace
                  (loader,pcElement,(ElementInstance *)local_58,
                   (uint)elt.alProperties.
                         super__Vector_base<Assimp::PLY::PropertyInstance,_std::allocator<Assimp::PLY::PropertyInstance>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
      }
      ElementInstance::~ElementInstance((ElementInstance *)local_58);
    }
    else {
      p_pcOut_00 = std::
                   vector<Assimp::PLY::ElementInstance,_std::allocator<Assimp::PLY::ElementInstance>_>
                   ::operator[](&p_pcOut->alInstances,
                                (ulong)(uint)elt.alProperties.
                                             super__Vector_base<Assimp::PLY::PropertyInstance,_std::allocator<Assimp::PLY::PropertyInstance>_>
                                             ._M_impl.super__Vector_impl_data._M_end_of_storage);
      ElementInstance::ParseInstanceBinary
                (streamBuffer,buffer,pCur,bufferSize,pcElement,p_pcOut_00,
                 (bool)(elt.alProperties.
                        super__Vector_base<Assimp::PLY::PropertyInstance,_std::allocator<Assimp::PLY::PropertyInstance>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ & 1));
    }
  }
  return true;
}

Assistant:

bool PLY::ElementInstanceList::ParseInstanceListBinary(
  IOStreamBuffer<char> &streamBuffer,
  std::vector<char> &buffer,
  const char* &pCur,
  unsigned int &bufferSize,
  const PLY::Element* pcElement,
  PLY::ElementInstanceList* p_pcOut,
  PLYImporter* loader,
  bool p_bBE /* = false */)
{
  ai_assert(NULL != pcElement);

  // we can add special handling code for unknown element semantics since
  // we can't skip it as a whole block (we don't know its exact size
  // due to the fact that lists could be contained in the property list
  // of the unknown element)
  for (unsigned int i = 0; i < pcElement->NumOccur; ++i)
  {
    if (p_pcOut)
      PLY::ElementInstance::ParseInstanceBinary(streamBuffer, buffer, pCur, bufferSize, pcElement, &p_pcOut->alInstances[i], p_bBE);
    else
    {
      ElementInstance elt;
      PLY::ElementInstance::ParseInstanceBinary(streamBuffer, buffer, pCur, bufferSize, pcElement, &elt, p_bBE);

      // Create vertex or face
      if (pcElement->eSemantic == EEST_Vertex)
      {
        //call loader instance from here
        loader->LoadVertex(pcElement, &elt, i);
      }
      else if (pcElement->eSemantic == EEST_Face)
      {
        //call loader instance from here
        loader->LoadFace(pcElement, &elt, i);
      }
      else if (pcElement->eSemantic == EEST_TriStrip)
      {
        //call loader instance from here
        loader->LoadFace(pcElement, &elt, i);
      }
    }
  }
  return true;
}